

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::AddFundamentalParameterData
          (IFF_Layer2 *this,IFF_ATC_NAVAIDS_FundamentalParameterData *FPD)

{
  size_type sVar1;
  IFF_ATC_NAVAIDS_FundamentalParameterData *FPD_local;
  IFF_Layer2 *this_local;
  
  std::
  vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
  ::push_back(&this->m_vFPD,FPD);
  (this->super_LayerHeader).m_ui16LayerLength = (this->super_LayerHeader).m_ui16LayerLength + 0x18;
  sVar1 = std::
          vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
          ::size(&this->m_vFPD);
  SecondaryOperationalData::SetNumberOfFundamentalParamSets(&this->m_SOD,(KUINT8)sVar1);
  return;
}

Assistant:

void IFF_Layer2::AddFundamentalParameterData( const IFF_ATC_NAVAIDS_FundamentalParameterData & FPD )
{
    m_vFPD.push_back( FPD );
    m_ui16LayerLength += IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE;
    m_SOD.SetNumberOfFundamentalParamSets( m_vFPD.size() );
}